

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopher.c
# Opt level: O3

CURLcode gopher_do(connectdata *conn,_Bool *done)

{
  curl_socket_t sockfd;
  Curl_easy *data;
  char *pcVar1;
  CURLcode CVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  char *sel;
  size_t len;
  ssize_t amount;
  char *local_50;
  char *local_48;
  size_t local_40;
  size_t local_38;
  
  data = conn->data;
  sockfd = conn->sock[0];
  pcVar4 = (data->state).up.path;
  pcVar1 = (data->state).up.query;
  local_50 = (char *)0x0;
  *done = true;
  if (pcVar1 == (char *)0x0) {
    pcVar4 = (*Curl_cstrdup)(pcVar4);
  }
  else {
    pcVar4 = curl_maprintf("%s?%s");
  }
  if (pcVar4 == (char *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar5 = strlen(pcVar4);
    if (sVar5 < 3) {
      local_50 = "";
      local_40 = 0;
      (*Curl_cfree)(pcVar4);
      local_48 = (char *)0x0;
      sVar6 = 0;
    }
    else {
      CVar2 = Curl_urldecode(data,pcVar4 + 2,0,&local_50,&local_40,false);
      (*Curl_cfree)(pcVar4);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      local_48 = local_50;
      sVar6 = local_40;
    }
    sVar6 = curlx_uztosz(sVar6);
    do {
      CVar2 = Curl_write(conn,sockfd,local_50,sVar6,(ssize_t *)&local_38);
      if ((CVar2 != CURLE_OK) ||
         (CVar2 = Curl_client_write(conn,2,local_50,local_38), CVar2 != CURLE_OK))
      goto LAB_00136afe;
      local_50 = local_50 + local_38;
      sVar7 = sVar6 - local_38;
      if (sVar7 == 0 || (long)sVar6 < (long)local_38) {
        (*Curl_cfree)(local_48);
        CVar2 = Curl_sendf(sockfd,conn,"\r\n");
        if (CVar2 == CURLE_OK) {
          CVar2 = Curl_client_write(conn,2,"\r\n",2);
          if (CVar2 != CURLE_OK) {
            return CVar2;
          }
          Curl_setup_transfer(data,0,-1,false,-1);
          return CURLE_OK;
        }
        goto LAB_00136b0c;
      }
      iVar3 = Curl_socket_check(-1,-1,sockfd,100);
      sVar6 = sVar7;
    } while (-1 < iVar3);
    CVar2 = CURLE_SEND_ERROR;
LAB_00136afe:
    (*Curl_cfree)(local_48);
LAB_00136b0c:
    Curl_failf(data,"Failed sending Gopher request");
  }
  return CVar2;
}

Assistant:

static CURLcode gopher_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  char *gopherpath;
  char *path = data->state.up.path;
  char *query = data->state.up.query;
  char *sel = NULL;
  char *sel_org = NULL;
  ssize_t amount, k;
  size_t len;

  *done = TRUE; /* unconditionally */

  /* path is guaranteed non-NULL */
  DEBUGASSERT(path);

  if(query)
    gopherpath = aprintf("%s?%s", path, query);
  else
    gopherpath = strdup(path);

  if(!gopherpath)
    return CURLE_OUT_OF_MEMORY;

  /* Create selector. Degenerate cases: / and /1 => convert to "" */
  if(strlen(gopherpath) <= 2) {
    sel = (char *)"";
    len = strlen(sel);
    free(gopherpath);
  }
  else {
    char *newp;

    /* Otherwise, drop / and the first character (i.e., item type) ... */
    newp = gopherpath;
    newp += 2;

    /* ... and finally unescape */
    result = Curl_urldecode(data, newp, 0, &sel, &len, FALSE);
    free(gopherpath);
    if(result)
      return result;
    sel_org = sel;
  }

  /* We use Curl_write instead of Curl_sendf to make sure the entire buffer is
     sent, which could be sizeable with long selectors. */
  k = curlx_uztosz(len);

  for(;;) {
    result = Curl_write(conn, sockfd, sel, k, &amount);
    if(!result) { /* Which may not have written it all! */
      result = Curl_client_write(conn, CLIENTWRITE_HEADER, sel, amount);
      if(result)
        break;

      k -= amount;
      sel += amount;
      if(k < 1)
        break; /* but it did write it all */
    }
    else
      break;

    /* Don't busyloop. The entire loop thing is a work-around as it causes a
       BLOCKING behavior which is a NO-NO. This function should rather be
       split up in a do and a doing piece where the pieces that aren't
       possible to send now will be sent in the doing function repeatedly
       until the entire request is sent.

       Wait a while for the socket to be writable. Note that this doesn't
       acknowledge the timeout.
    */
    if(SOCKET_WRITABLE(sockfd, 100) < 0) {
      result = CURLE_SEND_ERROR;
      break;
    }
  }

  free(sel_org);

  if(!result)
    /* We can use Curl_sendf to send the terminal \r\n relatively safely and
       save allocing another string/doing another _write loop. */
    result = Curl_sendf(sockfd, conn, "\r\n");
  if(result) {
    failf(data, "Failed sending Gopher request");
    return result;
  }
  result = Curl_client_write(conn, CLIENTWRITE_HEADER, (char *)"\r\n", 2);
  if(result)
    return result;

  Curl_setup_transfer(data, FIRSTSOCKET, -1, FALSE, -1);
  return CURLE_OK;
}